

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::
CopyMessageTest_ArenaEnabledCopyConstructorArenaLeakTest_Test::TestBody
          (CopyMessageTest_ArenaEnabledCopyConstructorArenaLeakTest_Test *this)

{
  pointer pcVar1;
  void *pvVar2;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *lhs;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *rhs;
  char *pcVar3;
  Arena arena;
  TestAllTypes message1;
  AssertHelper AStack_418;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_410;
  internal local_408 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_400;
  undefined1 local_3f8 [168];
  undefined1 local_350 [504];
  ArenaStringPtr local_158 [41];
  
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_350,(Arena *)0x0);
  pcVar1 = local_3f8 + 0x10;
  local_3f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct((ulong)local_3f8,-0x18);
  local_350[0x10] = local_350[0x10] | 1;
  if ((local_350._8_8_ & 1) != 0) {
    local_350._8_8_ = *(undefined8 *)(local_350._8_8_ & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set(local_158,(string *)local_3f8,(Arena *)local_350._8_8_);
  if ((pointer)local_3f8._0_8_ != pcVar1) {
    operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
  }
  local_3f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct((ulong)local_3f8,-0x18);
  protobuf::internal::RepeatedPtrFieldBase::
  Add<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            ((RepeatedPtrFieldBase *)(local_350 + 0xf0),
             (Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *)local_3f8);
  if ((pointer)local_3f8._0_8_ != pcVar1) {
    operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
  }
  protobuf::internal::ThreadSafeArena::ThreadSafeArena((ThreadSafeArena *)local_3f8);
  pvVar2 = Arena::CopyConstruct<proto2_unittest::TestAllTypes>((Arena *)local_3f8,local_350);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_408,"message2->optional_string()","message1.optional_string()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (*(ulong *)((long)pvVar2 + 0x1f8) & 0xfffffffffffffffc),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)local_158[0].tagged_ptr_.ptr_ & 0xfffffffffffffffc));
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_410);
    if (local_400 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar3 = (local_400->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/copy_unittest.cc"
               ,0x3b,pcVar3);
    testing::internal::AssertHelper::operator=(&AStack_418,(Message *)&local_410);
    testing::internal::AssertHelper::~AssertHelper(&AStack_418);
    if (local_410._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_410._M_head_impl + 8))();
    }
  }
  if (local_400 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_400,local_400);
  }
  lhs = protobuf::internal::RepeatedPtrFieldBase::
        Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                  ((RepeatedPtrFieldBase *)((long)pvVar2 + 0xf0),0);
  rhs = protobuf::internal::RepeatedPtrFieldBase::
        Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                  ((RepeatedPtrFieldBase *)(local_350 + 0xf0),0);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_408,"message2->repeated_string(0)","message1.repeated_string(0)",lhs,rhs);
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_410);
    if (local_400 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar3 = (local_400->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/copy_unittest.cc"
               ,0x3c,pcVar3);
    testing::internal::AssertHelper::operator=(&AStack_418,(Message *)&local_410);
    testing::internal::AssertHelper::~AssertHelper(&AStack_418);
    if (local_410._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_410._M_head_impl + 8))();
    }
  }
  if (local_400 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_400,local_400);
  }
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena((ThreadSafeArena *)local_3f8);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_350);
  return;
}

Assistant:

TEST(CopyMessageTest, ArenaEnabledCopyConstructorArenaLeakTest) {
  // Set possible leaking field types for TestAllTypes with values
  // guaranteed to not be inlined string or Cord values.
  // TestAllTypes has unconditional ArenaDtor registration.
  proto2_unittest::TestAllTypes message1;

  message1.set_optional_string(std::string(1000, 'a'));
  message1.add_repeated_string(std::string(1000, 'd'));

  Arena arena;
  proto2_unittest::TestAllTypes* message2 =
      Arena::Create<proto2_unittest::TestAllTypes>(&arena, message1);

  EXPECT_EQ(message2->optional_string(), message1.optional_string());
  EXPECT_EQ(message2->repeated_string(0), message1.repeated_string(0));
}